

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambdaref_expression.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::LambdaRefExpression::Copy(LambdaRefExpression *this)

{
  InternalException *this_00;
  string local_40;
  
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "lambda reference expressions are transient, Copy should never be called","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<ParsedExpression> LambdaRefExpression::Copy() const {
	throw InternalException("lambda reference expressions are transient, Copy should never be called");
}